

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Paths *polys)

{
  pointer pIVar1;
  int iVar2;
  size_type __n;
  pointer pIVar3;
  reference ppOVar4;
  int local_58;
  int i_1;
  OutPt *pOStack_40;
  int cnt;
  OutPt *p;
  Path pg;
  size_type i;
  Paths *polys_local;
  Clipper *this_local;
  
  __n = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                  ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                   ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]));
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(polys,__n);
  for (pg.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar1 = pg.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
      pIVar3 = (pointer)std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                        size((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                             ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3])),
      pIVar1 < pIVar3;
      pg.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(pg.
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->X + 1)) {
    ppOVar4 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),
                         (size_type)
                         pg.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*ppOVar4)->Pts != (OutPt *)0x0) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&p);
      ppOVar4 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                          ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                           ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),
                           (size_type)
                           pg.
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pOStack_40 = (*ppOVar4)->Pts->Prev;
      iVar2 = PointCount(pOStack_40);
      if (1 < iVar2) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&p,
                   (long)iVar2);
        for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&p,
                     &pOStack_40->Pt);
          pOStack_40 = pOStack_40->Prev;
        }
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(polys,(value_type *)&p);
      }
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&p);
    }
  }
  return;
}

Assistant:

void Clipper::BuildResult(Paths &polys)
{
  polys.reserve(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (!m_PolyOuts[i]->Pts) continue;
    Path pg;
    OutPt* p = m_PolyOuts[i]->Pts->Prev;
    int cnt = PointCount(p);
    if (cnt < 2) continue;
    pg.reserve(cnt);
    for (int i = 0; i < cnt; ++i)
    {
      pg.push_back(p->Pt);
      p = p->Prev;
    }
    polys.push_back(pg);
  }
}